

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DigitTest.hpp
# Opt level: O2

void Qentem::Test::TestStringToNumber1(QTest *test)

{
  bool bVar1;
  double d_number;
  SizeT64 number;
  undefined8 local_40;
  double local_38;
  unsigned_long_long local_30;
  
  local_30 = 0;
  local_38 = 0.0;
  bVar1 = StringToNumber<unsigned_long_long>(test,&local_30,"");
  QTest::IsFalse(test,bVar1,0x9a);
  bVar1 = StringToNumber<unsigned_long_long>(test,&local_30,"0");
  QTest::IsTrue(test,bVar1,0x9d);
  local_40 = (double)((ulong)local_40._4_4_ << 0x20);
  QTest::IsEqual<unsigned_long_long,unsigned_int>(test,&local_30,(uint *)&local_40,0x9e);
  bVar1 = StringToNumber<double>(test,&local_38,"0.0");
  QTest::IsTrue(test,bVar1,0xa1);
  local_40 = 0.0;
  QTest::IsEqual<double,double>(test,&local_38,(double *)&local_40,0xa2);
  bVar1 = StringToNumber<double>(test,&local_38,"-0");
  QTest::IsTrue(test,bVar1,0xa5);
  local_40 = -0.0;
  QTest::IsEqual<double,double>(test,&local_38,(double *)&local_40,0xa6);
  bVar1 = StringToNumber<double>(test,&local_38,"-0.0");
  QTest::IsTrue(test,bVar1,0xa9);
  local_40 = -0.0;
  QTest::IsEqual<double,double>(test,&local_38,(double *)&local_40,0xaa);
  bVar1 = StringToNumber<unsigned_long_long>(test,&local_30,"1");
  QTest::IsTrue(test,bVar1,0xad);
  local_40._0_4_ = 1;
  QTest::IsEqual<unsigned_long_long,unsigned_int>(test,&local_30,(uint *)&local_40,0xae);
  bVar1 = StringToNumber<unsigned_long_long>(test,&local_30,"1000000");
  QTest::IsTrue(test,bVar1,0xb1);
  local_40._0_4_ = 1000000;
  QTest::IsEqual<unsigned_long_long,unsigned_int>(test,&local_30,(uint *)&local_40,0xb2);
  bVar1 = StringToNumber<unsigned_long_long>(test,&local_30,"1010101");
  QTest::IsTrue(test,bVar1,0xb5);
  local_40._0_4_ = 0xf69b5;
  QTest::IsEqual<unsigned_long_long,unsigned_int>(test,&local_30,(uint *)&local_40,0xb6);
  bVar1 = StringToNumber<unsigned_long_long>(test,&local_30,"9999999");
  QTest::IsTrue(test,bVar1,0xb9);
  local_40._0_4_ = 9999999;
  QTest::IsEqual<unsigned_long_long,unsigned_int>(test,&local_30,(uint *)&local_40,0xba);
  bVar1 = StringToNumber<unsigned_long_long>(test,&local_30,"123456789");
  QTest::IsTrue(test,bVar1,0xbd);
  local_40 = (double)CONCAT44(local_40._4_4_,0x75bcd15);
  QTest::IsEqual<unsigned_long_long,unsigned_int>(test,&local_30,(uint *)&local_40,0xbe);
  return;
}

Assistant:

static void TestStringToNumber1(QTest &test) {
    SizeT64     number   = 0;
    double      d_number = 0;
    const char *str;

    str = "";
    test.IsFalse(StringToNumber(test, number, str), __LINE__);

    str = "0";
    test.IsTrue(StringToNumber(test, number, str), __LINE__);
    test.IsEqual(number, 0U, __LINE__);

    str = "0.0";
    test.IsTrue(StringToNumber(test, d_number, str), __LINE__);
    test.IsEqual(d_number, 0.0, __LINE__);

    str = "-0";
    test.IsTrue(StringToNumber(test, d_number, str), __LINE__);
    test.IsEqual(d_number, -0.0, __LINE__);

    str = "-0.0";
    test.IsTrue(StringToNumber(test, d_number, str), __LINE__);
    test.IsEqual(d_number, -0.0, __LINE__);

    str = "1";
    test.IsTrue(StringToNumber(test, number, str), __LINE__);
    test.IsEqual(number, 1U, __LINE__);

    str = "1000000";
    test.IsTrue(StringToNumber(test, number, str), __LINE__);
    test.IsEqual(number, 1000000U, __LINE__);

    str = "1010101";
    test.IsTrue(StringToNumber(test, number, str), __LINE__);
    test.IsEqual(number, 1010101U, __LINE__);

    str = "9999999";
    test.IsTrue(StringToNumber(test, number, str), __LINE__);
    test.IsEqual(number, 9999999U, __LINE__);

    str = "123456789";
    test.IsTrue(StringToNumber(test, number, str), __LINE__);
    test.IsEqual(number, 123456789U, __LINE__);
}